

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# krb5kdf.c
# Opt level: O0

int KRB5KDF(EVP_CIPHER *cipher,ENGINE *engine,uchar *key,size_t key_len,uchar *constant,
           size_t constant_len,uchar *okey,size_t okey_len)

{
  int iVar1;
  uint uVar2;
  EVP_CIPHER_CTX *ctx_00;
  EVP_CIPHER *cipher_00;
  ENGINE *in_RCX;
  EVP_CIPHER *in_RDI;
  EVP_CIPHER_CTX *in_R9;
  long in_stack_00000008;
  int olen;
  int ret;
  int des3_no_fixup;
  size_t osize;
  size_t cipherlen;
  size_t blocksize;
  uchar *cipherblock;
  uchar *plainblock;
  uchar block [64];
  EVP_CIPHER_CTX *ctx;
  EVP_CIPHER_CTX *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  int line;
  ENGINE *in_stack_ffffffffffffff50;
  ENGINE *engine_00;
  EVP_CIPHER *in_stack_ffffffffffffff58;
  EVP_CIPHER_CTX *in_stack_ffffffffffffff60;
  uchar *local_98;
  uchar *local_90;
  size_t in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff8c;
  uchar *in_stack_ffffffffffffff90;
  uchar auStack_68 [40];
  EVP_CIPHER_CTX *local_40;
  EVP_CIPHER_CTX *local_38;
  ENGINE *local_28;
  EVP_CIPHER *local_10;
  
  local_40 = (EVP_CIPHER_CTX *)0x0;
  line = 0;
  local_38 = in_R9;
  local_10 = in_RDI;
  if (in_RCX != _ret) {
    local_28 = in_RCX;
    iVar1 = EVP_CIPHER_get_nid(in_RDI);
    if (((iVar1 != 0x2c) || (local_28 != (ENGINE *)0x18)) || (_ret != (ENGINE *)0x15)) {
      ERR_new();
      ERR_set_debug((char *)in_stack_ffffffffffffff50,line,
                    (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      ERR_set_error(0x39,0x8b,(char *)0x0);
      return 0;
    }
    line = 1;
  }
  local_40 = EVP_CIPHER_CTX_new();
  if (local_40 == (EVP_CIPHER_CTX *)0x0) {
    iVar1 = 0;
  }
  else {
    uVar2 = cipher_init(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                        in_stack_ffffffffffffff50,(uchar *)CONCAT44(line,in_stack_ffffffffffffff48),
                        CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (uVar2 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = EVP_CIPHER_CTX_get_block_size((EVP_CIPHER_CTX *)0x3279d5);
      ctx_00 = (EVP_CIPHER_CTX *)(long)iVar1;
      if (ctx_00 < local_38) {
        ERR_new();
        ERR_set_debug((char *)in_stack_ffffffffffffff50,line,
                      (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        ERR_set_error(0x39,0x9d,(char *)0x0);
        iVar1 = 0;
      }
      else {
        n_fold(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78);
        local_90 = &stack0xffffffffffffff78;
        local_98 = auStack_68;
        for (engine_00 = (ENGINE *)0x0; engine_00 < _ret;
            engine_00 = (ENGINE *)((long)&engine_00->id + (long)&cipher_00->nid)) {
          iVar1 = EVP_EncryptUpdate(local_40,local_98,(int *)&stack0xffffffffffffff44,local_90,
                                    (int)ctx_00);
          if (iVar1 == 0) {
            iVar1 = 0;
            goto LAB_00327c9e;
          }
          cipher_00 = (EVP_CIPHER *)(long)in_stack_ffffffffffffff44;
          uVar2 = EVP_EncryptFinal_ex(local_40,local_98,(int *)&stack0xffffffffffffff44);
          if (uVar2 == 0) {
            iVar1 = 0;
            goto LAB_00327c9e;
          }
          if (in_stack_ffffffffffffff44 != 0) {
            ERR_new();
            ERR_set_debug((char *)engine_00,line,
                          (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            ERR_set_error(0x39,0x6b,(char *)0x0);
            iVar1 = 0;
            goto LAB_00327c9e;
          }
          if ((EVP_CIPHER *)((long)_ret - (long)engine_00) < cipher_00) {
            cipher_00 = (EVP_CIPHER *)((long)_ret - (long)engine_00);
          }
          memcpy((char *)((long)&engine_00->id + in_stack_00000008),local_98,(size_t)cipher_00);
          if ((ENGINE *)((long)&cipher_00->nid + (long)&engine_00->id) < _ret) {
            iVar1 = EVP_CIPHER_CTX_reset(in_stack_ffffffffffffff38);
            if (iVar1 == 0) {
              iVar1 = 0;
              goto LAB_00327c9e;
            }
            uVar2 = cipher_init(ctx_00,cipher_00,engine_00,(uchar *)CONCAT44(line,iVar1),
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            if (uVar2 == 0) {
              iVar1 = 0;
              goto LAB_00327c9e;
            }
            local_90 = local_98;
            if (local_98 == &stack0xffffffffffffff78) {
              local_98 = local_98 + 0x20;
            }
            else {
              local_98 = &stack0xffffffffffffff78;
            }
          }
        }
        iVar1 = EVP_CIPHER_get_nid(local_10);
        if (((iVar1 == 0x2c) && (line == 0)) &&
           (iVar1 = fixup_des3_key((uchar *)(ulong)uVar2), iVar1 == 0)) {
          ERR_new();
          ERR_set_debug((char *)engine_00,line,
                        (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          ERR_set_error(0x39,0x79,(char *)0x0);
        }
        else {
          iVar1 = 1;
        }
      }
    }
LAB_00327c9e:
    EVP_CIPHER_CTX_free(local_40);
    OPENSSL_cleanse(&stack0xffffffffffffff78,0x40);
  }
  return iVar1;
}

Assistant:

static int KRB5KDF(const EVP_CIPHER *cipher, ENGINE *engine,
                   const unsigned char *key, size_t key_len,
                   const unsigned char *constant, size_t constant_len,
                   unsigned char *okey, size_t okey_len)
{
    EVP_CIPHER_CTX *ctx = NULL;
    unsigned char block[EVP_MAX_BLOCK_LENGTH * 2];
    unsigned char *plainblock, *cipherblock;
    size_t blocksize;
    size_t cipherlen;
    size_t osize;
#ifndef OPENSSL_NO_DES
    int des3_no_fixup = 0;
#endif
    int ret;

    if (key_len != okey_len) {
#ifndef OPENSSL_NO_DES
        /* special case for 3des, where the caller may be requesting
         * the random raw key, instead of the fixed up key  */
        if (EVP_CIPHER_get_nid(cipher) == NID_des_ede3_cbc &&
            key_len == 24 && okey_len == 21) {
                des3_no_fixup = 1;
        } else {
#endif
            ERR_raise(ERR_LIB_PROV, PROV_R_WRONG_OUTPUT_BUFFER_SIZE);
            return 0;
#ifndef OPENSSL_NO_DES
        }
#endif
    }

    ctx = EVP_CIPHER_CTX_new();
    if (ctx == NULL)
        return 0;

    ret = cipher_init(ctx, cipher, engine, key, key_len);
    if (!ret)
        goto out;

    /* Initialize input block */
    blocksize = EVP_CIPHER_CTX_get_block_size(ctx);

    if (constant_len > blocksize) {
        ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_CONSTANT_LENGTH);
        ret = 0;
        goto out;
    }

    n_fold(block, blocksize, constant, constant_len);
    plainblock = block;
    cipherblock = block + EVP_MAX_BLOCK_LENGTH;

    for (osize = 0; osize < okey_len; osize += cipherlen) {
        int olen;

        ret = EVP_EncryptUpdate(ctx, cipherblock, &olen,
                                plainblock, blocksize);
        if (!ret)
            goto out;
        cipherlen = olen;
        ret = EVP_EncryptFinal_ex(ctx, cipherblock, &olen);
        if (!ret)
            goto out;
        if (olen != 0) {
            ERR_raise(ERR_LIB_PROV, PROV_R_WRONG_FINAL_BLOCK_LENGTH);
            ret = 0;
            goto out;
        }

        /* write cipherblock out */
        if (cipherlen > okey_len - osize)
            cipherlen = okey_len - osize;
        memcpy(okey + osize, cipherblock, cipherlen);

        if (okey_len > osize + cipherlen) {
            /* we need to reinitialize cipher context per spec */
            ret = EVP_CIPHER_CTX_reset(ctx);
            if (!ret)
                goto out;
            ret = cipher_init(ctx, cipher, engine, key, key_len);
            if (!ret)
                goto out;

            /* also swap block offsets so last ciphertext becomes new
             * plaintext */
            plainblock = cipherblock;
            if (cipherblock == block) {
                cipherblock += EVP_MAX_BLOCK_LENGTH;
            } else {
                cipherblock = block;
            }
        }
    }

#ifndef OPENSSL_NO_DES
    if (EVP_CIPHER_get_nid(cipher) == NID_des_ede3_cbc && !des3_no_fixup) {
        ret = fixup_des3_key(okey);
        if (!ret) {
            ERR_raise(ERR_LIB_PROV, PROV_R_FAILED_TO_GENERATE_KEY);
            goto out;
        }
    }
#endif

    ret = 1;

out:
    EVP_CIPHER_CTX_free(ctx);
    OPENSSL_cleanse(block, EVP_MAX_BLOCK_LENGTH * 2);
    return ret;
}